

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
* __thiscall
ska::detailv3::
sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
::operator=(sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            *this,sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  *other)

{
  EntryPointer psVar1;
  float fVar2;
  char cVar3;
  size_t sVar4;
  EntryPointer psVar5;
  long lVar6;
  ulong uVar7;
  ulong num_buckets;
  EntryPointer psVar8;
  double dVar9;
  
  if (this != other) {
    psVar8 = this->entries;
    sVar4 = this->num_slots_minus_one;
    cVar3 = this->max_lookups;
    if (psVar8 != psVar8 + sVar4 + (long)cVar3) {
      lVar6 = 0;
      do {
        if (-1 < (&psVar8->distance_from_desired)[lVar6]) {
          (&psVar8->distance_from_desired)[lVar6] = -1;
        }
        lVar6 = lVar6 + 0x18;
      } while ((long)cVar3 * 0x18 + sVar4 * 0x18 != lVar6);
    }
    this->num_elements = 0;
    fVar2 = other->_max_load_factor;
    this->_max_load_factor = fVar2;
    dVar9 = (double)fVar2;
    if (0.5 <= dVar9) {
      dVar9 = 0.5;
    }
    dVar9 = ceil((((double)CONCAT44(0x45300000,(int)(other->num_elements >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)other->num_elements) - 4503599627370496.0)) /
                 dVar9);
    uVar7 = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
    num_buckets = other->num_slots_minus_one + 1;
    if (other->num_slots_minus_one == 0) {
      num_buckets = 0;
    }
    if (uVar7 <= num_buckets) {
      num_buckets = uVar7;
    }
    rehash(this,num_buckets);
    psVar5 = other->entries;
    psVar8 = psVar5 + -1;
    lVar6 = 0x18;
    do {
      lVar6 = lVar6 + -0x18;
      psVar1 = psVar8 + 1;
      psVar8 = psVar8 + 1;
    } while (psVar1->distance_from_desired < '\0');
    sVar4 = other->num_slots_minus_one;
    cVar3 = other->max_lookups;
    if (sVar4 * 0x18 + (long)cVar3 * 0x18 + lVar6 != 0) {
      do {
        sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace<std::basic_string_view<char,std::char_traits<char>>const&>
                  ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                    *)this,&(psVar8->field_1).value);
        do {
          psVar1 = psVar8 + 1;
          psVar8 = psVar8 + 1;
        } while (psVar1->distance_from_desired < '\0');
      } while (psVar8 != psVar5 + sVar4 + (long)cVar3);
    }
  }
  return this;
}

Assistant:

sherwood_v3_table & operator=(const sherwood_v3_table & other)
    {
        if (this == std::addressof(other))
            return *this;

        clear();
        if (AllocatorTraits::propagate_on_container_copy_assignment::value)
        {
            if (static_cast<EntryAlloc &>(*this) != static_cast<const EntryAlloc &>(other))
            {
                reset_to_empty_state();
            }
            AssignIfTrue<EntryAlloc, AllocatorTraits::propagate_on_container_copy_assignment::value>()(*this, other);
        }
        _max_load_factor = other._max_load_factor;
        static_cast<Hasher &>(*this) = other;
        static_cast<Equal &>(*this) = other;
        rehash_for_other_container(other);
        insert(other.begin(), other.end());
        return *this;
    }